

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O2

PSNode * __thiscall
dg::pta::PointerGraph::create<(dg::pta::PSNodeType)12,dg::pta::PSNode*&>
          (PointerGraph *this,PSNode **args)

{
  PSNode *n;
  type local_18;
  
  local_18 = nodeFactory<(dg::pta::PSNodeType)12,dg::pta::PSNode*&,dg::pta::PSNodeRet>(this,args);
  std::
  vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
  ::emplace_back<dg::pta::PSNode*&>
            ((vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
              *)(this + 0x10),(PSNode **)&local_18);
  return &local_18->super_PSNode;
}

Assistant:

PSNode *create(Args &&...args) {
        PSNode *n = nodeFactory<Type>(std::forward<Args>(args)...);
        nodes.emplace_back(n); // C++17 returns a referece
        assert(n->getID() == nodes.size() - 1);
        return n;
    }